

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O3

int mbedtls_x509write_crt_set_validity(mbedtls_x509write_cert *ctx,char *not_before,char *not_after)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = strlen(not_before);
  iVar2 = -0x2800;
  if (sVar1 == 0xe) {
    sVar1 = strlen(not_after);
    if (sVar1 == 0xe) {
      strncpy(ctx->not_before,not_before,0xf);
      strncpy(ctx->not_after,not_after,0xf);
      ctx->not_before[0xe] = 'Z';
      ctx->not_after[0xe] = 'Z';
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_x509write_crt_set_validity( mbedtls_x509write_cert *ctx, const char *not_before,
                                const char *not_after )
{
    if( strlen( not_before ) != MBEDTLS_X509_RFC5280_UTC_TIME_LEN - 1 ||
        strlen( not_after )  != MBEDTLS_X509_RFC5280_UTC_TIME_LEN - 1 )
    {
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );
    }
    strncpy( ctx->not_before, not_before, MBEDTLS_X509_RFC5280_UTC_TIME_LEN );
    strncpy( ctx->not_after , not_after , MBEDTLS_X509_RFC5280_UTC_TIME_LEN );
    ctx->not_before[MBEDTLS_X509_RFC5280_UTC_TIME_LEN - 1] = 'Z';
    ctx->not_after[MBEDTLS_X509_RFC5280_UTC_TIME_LEN - 1] = 'Z';

    return( 0 );
}